

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O2

vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_> * __thiscall
dgrminer::PartialUnion::createAdjacencyLists
          (vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
           *__return_storage_ptr__,PartialUnion *this,
          vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *newedges,
          int snapshots)

{
  undefined4 *puVar1;
  pointer pvVar2;
  ulong uVar3;
  iterator iVar4;
  undefined4 in_register_0000000c;
  ulong uVar5;
  long lVar6;
  int iVar7;
  pointer paVar8;
  pointer paVar9;
  ulong uVar10;
  ulong uVar11;
  int id_counter;
  allocator_type local_131;
  vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_> *local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *local_110;
  AdjacencyListCrate alc;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adjacencyMoreInfo;
  vector<int,_std::allocator<int>_> numbers_of_nodes;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adjacencyList;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> adjacencyListNodes;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> new_node_ids;
  
  local_120 = CONCAT44(in_register_0000000c,snapshots);
  new_node_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &new_node_ids._M_t._M_impl.super__Rb_tree_header._M_header;
  new_node_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  new_node_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  new_node_ids._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  id_counter = 0;
  numbers_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  numbers_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  numbers_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  paVar9 = (this->nodes).
           super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar7 = 1;
  uVar10 = 0;
  uVar11 = 0;
  uVar5 = 0;
  local_130 = __return_storage_ptr__;
  local_110 = newedges;
  new_node_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       new_node_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    uVar3 = ((long)(this->nodes).
                   super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)paVar9) / 0x18;
    if (uVar3 < uVar11) break;
    if ((uVar11 == uVar3) || (iVar7 < paVar9[uVar11]._M_elems[0])) {
      std::vector<int,_std::allocator<int>_>::push_back(&numbers_of_nodes,&id_counter);
      paVar8 = (this->edges).
               super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      for (uVar10 = uVar5 << 5 | 4;
          (uVar5 < (ulong)((long)(this->edges).
                                 super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)paVar8 >> 5) &&
          (*(int *)((long)paVar8->_M_elems + (uVar10 - 4)) <= iVar7)); uVar10 = uVar10 + 0x20) {
        iVar4 = std::
                _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                ::find((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                        *)&new_node_ids,(key_type *)((long)paVar8->_M_elems + uVar10));
        puVar1 = (undefined4 *)
                 ((long)((this->edges).
                         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_elems + uVar10);
        *puVar1 = *(undefined4 *)&iVar4._M_node[1].field_0x4;
        iVar4 = std::
                _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                ::find((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                        *)&new_node_ids,puVar1 + 1);
        paVar8 = (this->edges).
                 super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        *(undefined4 *)((long)paVar8->_M_elems + uVar10 + 4) =
             *(undefined4 *)&iVar4._M_node[1].field_0x4;
        uVar5 = uVar5 + 1;
      }
      if (uVar11 == ((long)(this->nodes).
                           super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->nodes).
                          super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18) break;
      iVar7 = iVar7 + 1;
      id_counter = 0;
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::clear((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)&new_node_ids);
      paVar9 = (this->nodes).
               super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar10 = (ulong)(uint)id_counter;
    }
    alc.adjacencyList.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(uVar10 << 0x20 | (ulong)(uint)paVar9[uVar11]._M_elems[1]);
    std::
    _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
    ::_M_emplace_unique<std::pair<int,int>>
              ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                *)&new_node_ids,(pair<int,_int> *)&alc);
    paVar9 = (this->nodes).
             super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    paVar9[uVar11]._M_elems[1] = id_counter;
    id_counter = id_counter + 1;
    uVar10 = (ulong)(uint)id_counter;
    uVar11 = uVar11 + 1;
  }
  (local_130->
  super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_130->
  super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_130->
  super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar10 = 0;
  iVar7 = (int)local_120;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  local_120 = (ulong)(iVar7 + 1);
  uVar5 = 1;
  uVar11 = 0;
  while (uVar5 != local_120) {
    iVar7 = numbers_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5 - 1];
    local_128 = uVar11;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&alc,0,(allocator_type *)&adjacencyMoreInfo);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector(&adjacencyList,(long)iVar7,(value_type *)&alc,(allocator_type *)&adjacencyListNodes);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&alc);
    iVar7 = numbers_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5 - 1];
    std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
              ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&alc,0,
               (allocator_type *)&adjacencyListNodes);
    std::
    vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
    ::vector(&adjacencyMoreInfo,(long)iVar7,(value_type *)&alc,&local_131);
    std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~_Vector_base
              ((_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&alc);
    adjacencyListNodes.
    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    adjacencyListNodes.
    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    adjacencyListNodes.
    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar6 = local_128 * 0x18 + 0x10;
    while( true ) {
      paVar9 = (this->nodes).
               super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (((ulong)(((long)(this->nodes).
                          super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)paVar9) / 0x18) <=
           local_128) || ((long)uVar5 < (long)*(int *)((long)paVar9->_M_elems + lVar6 + -0x10)))
      break;
      alc.adjacencyList.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(*(undefined4 *)((long)paVar9->_M_elems + lVar6),
                             *(undefined4 *)((long)paVar9->_M_elems + lVar6 + -0xc));
      alc.adjacencyList.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(alc.adjacencyList.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                             *(undefined4 *)((long)paVar9->_M_elems + lVar6 + -8));
      std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::push_back
                (&adjacencyListNodes,(value_type *)&alc);
      local_128 = local_128 + 1;
      lVar6 = lVar6 + 0x18;
    }
    lVar6 = uVar10 << 5;
    local_118 = uVar5;
    while( true ) {
      paVar8 = (this->edges).
               super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (((ulong)((long)(this->edges).
                         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)paVar8 >> 5) <= uVar10)
         || ((long)local_118 < (long)*(int *)((long)paVar8->_M_elems + lVar6))) break;
      std::vector<int,_std::allocator<int>_>::push_back
                (adjacencyList.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 *(int *)((long)paVar8->_M_elems + lVar6 + 4),
                 (value_type_conflict *)((long)paVar8->_M_elems + lVar6 + 8));
      paVar8 = (this->edges).
               super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      std::vector<int,_std::allocator<int>_>::push_back
                (adjacencyList.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 *(int *)((long)paVar8->_M_elems + lVar6 + 8),
                 (value_type_conflict *)((long)paVar8->_M_elems + lVar6 + 4));
      std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::push_back
                (adjacencyMoreInfo.
                 super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 *(int *)((long)((this->edges).
                                 super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar6 + 4),
                 (value_type *)
                 ((long)((local_110->
                         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar6));
      pvVar2 = adjacencyMoreInfo.
               super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar7 = *(int *)((long)((this->edges).
                              super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar6 + 8);
      flipAdjacencyInfo((array<int,_8UL> *)
                        ((long)((local_110->
                                super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar6));
      std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>::
      emplace_back<std::array<int,8ul>>
                ((vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>> *)(pvVar2 + iVar7)
                 ,(array<int,_8UL> *)&alc);
      uVar10 = uVar10 + 1;
      lVar6 = lVar6 + 0x20;
    }
    alc.nodes.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    alc.nodes.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    alc.adjacencyEdgeInfo.
    super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    alc.adjacencyEdgeInfo.
    super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    alc.adjacencyList.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    alc.adjacencyEdgeInfo.
    super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    alc.adjacencyList.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    alc.adjacencyList.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    alc.nodes.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator=(&alc.adjacencyList,&adjacencyList);
    std::
    vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
    ::operator=(&alc.adjacencyEdgeInfo,&adjacencyMoreInfo);
    std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::operator=
              (&alc.nodes,
               (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
               &adjacencyListNodes.
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>);
    std::vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::
    push_back(local_130,&alc);
    AdjacencyListCrate::~AdjacencyListCrate(&alc);
    std::_Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::~_Vector_base
              (&adjacencyListNodes.
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>);
    std::
    vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
    ::~vector(&adjacencyMoreInfo);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&adjacencyList);
    uVar11 = local_128;
    uVar5 = local_118 + 1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&numbers_of_nodes.super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&new_node_ids._M_t);
  return local_130;
}

Assistant:

std::vector<AdjacencyListCrate> PartialUnion::createAdjacencyLists(std::vector<std::array<int, 8>> & newedges, int snapshots)
	{
		// RENAME IDS (so IDS are from 0 to N)
		int current_snapshot = 1;  // because first time stamp == 1
		std::map<int, int> new_node_ids;
		int id_counter = 0;

		vector<int> numbers_of_nodes; // how many nodes there are in each snapshot


		size_t edges_processed_index = 0;
		for (size_t i = 0; i <= nodes.size(); i++)
		{

			if (i == nodes.size() || nodes[i][PN_TIME] > current_snapshot)
			{
				// doing next snapshot
				numbers_of_nodes.push_back(id_counter);

				// rename edges
				for (; edges_processed_index < edges.size() && edges[edges_processed_index][PE_TIME] <= current_snapshot; edges_processed_index++)
				{
					edges[edges_processed_index][PE_SRC] = new_node_ids.find(edges[edges_processed_index][PE_SRC])->second;
					edges[edges_processed_index][PE_DST] = new_node_ids.find(edges[edges_processed_index][PE_DST])->second;
				}

				// after all elements are processed, end
				if (i == nodes.size()) break;
				// reset counters:

				current_snapshot++;

				id_counter = 0;
				new_node_ids.clear();

			}

			new_node_ids.insert(std::make_pair(nodes[i][PN_ID], id_counter));

			// rename node ids:
			nodes[i][PN_ID] = id_counter;

			id_counter++;
		}

		// BUILD ADJACENCY LISTS:
		std::vector<AdjacencyListCrate> adjacency_lists;
		current_snapshot = 1;
		size_t e_index = 0;
		size_t n_index = 0;
		for (int current_snapshot = 1; current_snapshot <= snapshots; current_snapshot++)
		{
			// for each snapshot
			// initialize vectors of appropriate sizes:
			std::vector<std::vector<int>> adjacencyList(numbers_of_nodes[current_snapshot - 1], std::vector<int>(0));
			std::vector<std::vector<std::array<int, ADJ_INFO___SIZE>>> adjacencyMoreInfo(
				numbers_of_nodes[current_snapshot - 1],
				std::vector<std::array<int, ADJ_INFO___SIZE>>(0)
			);
			std::vector<std::array<int, ADJ_NODES___SIZE>> adjacencyListNodes; // NEW

			while (n_index < nodes.size() && nodes[n_index][PN_TIME] <= current_snapshot)
			{
				// fill all nodes in the current snapshot:
				std::array<int, ADJ_NODES___SIZE> node = { nodes[n_index][PN_ID], nodes[n_index][PN_CHANGETIME], nodes[n_index][PN_LABEL] };
				adjacencyListNodes.push_back(node);
				n_index++;
			}
			while (e_index < edges.size() && edges[e_index][PE_TIME] <= current_snapshot)
			{
				// fill all edges of the current snapshot:
				adjacencyList[edges[e_index][PE_SRC]].push_back(edges[e_index][PE_DST]);
				adjacencyList[edges[e_index][PE_DST]].push_back(edges[e_index][PE_SRC]);
				adjacencyMoreInfo[edges[e_index][PE_SRC]].push_back(newedges[e_index]);
				adjacencyMoreInfo[edges[e_index][PE_DST]].push_back(flipAdjacencyInfo(newedges[e_index]));
				e_index++;
			}
			// create new struct element
			AdjacencyListCrate alc;
			alc.adjacencyList = adjacencyList;
			alc.adjacencyEdgeInfo = adjacencyMoreInfo;
			alc.nodes = adjacencyListNodes;
			adjacency_lists.push_back(alc);
		}


		return adjacency_lists;
	}